

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

AcoshLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_acosh(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x307) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x307;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    AcoshLayerParams::AcoshLayerParams(this_00.acosh_);
    (this->layer_).acosh_ = (AcoshLayerParams *)this_00;
  }
  return (AcoshLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::AcoshLayerParams* NeuralNetworkLayer::mutable_acosh() {
  if (!has_acosh()) {
    clear_layer();
    set_has_acosh();
    layer_.acosh_ = new ::CoreML::Specification::AcoshLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.acosh)
  return layer_.acosh_;
}